

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
ElementsTransactionApi_FundRawTransaction_MillionAmountValue_Test::TestBody
          (ElementsTransactionApi_FundRawTransaction_MillionAmountValue_Test *this)

{
  initializer_list<cfd::UtxoData> __l;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  uint32_t uVar4;
  char *pcVar5;
  char *pcVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_bool>
  pVar7;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar8;
  Amount AVar9;
  AssertionResult gtest_ar_3;
  uint32_t minimum_fee;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  CfdException *anon_var_0_1;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  CfdException *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  ByteData tx;
  ConfidentialTransactionController ctx;
  ElementsTransactionApi api;
  ConfidentialTransactionContext txc;
  Amount fee;
  CoinSelectionOption option;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  append_txout_addresses;
  UtxoFilter filter;
  Amount estimate_fee;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  selected_txin_utxos;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  reserve_txout_address;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  map_target_value;
  ConfidentialAssetId fee_asset;
  double fee_rate;
  ElementsConfidentialAddress reserve_ct_addr3;
  ElementsConfidentialAddress reserve_ct_addr2;
  ElementsConfidentialAddress reserve_ct_addr1;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ExtPubkey key;
  Address address3;
  Address address2;
  Address address1;
  UtxoData utxo3;
  UtxoData utxo2;
  UtxoData utxo1;
  ElementsAddressFactory factory;
  ConfidentialAssetId *in_stack_ffffffffffffc178;
  AbstractTransactionController *this_00;
  UtxoData *in_stack_ffffffffffffc180;
  UtxoData *this_01;
  undefined4 in_stack_ffffffffffffc188;
  undefined4 uVar10;
  undefined4 in_stack_ffffffffffffc18c;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffc190;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *this_02;
  allocator_type *in_stack_ffffffffffffc1a8;
  string *tx_hex;
  undefined4 in_stack_ffffffffffffc1b0;
  undefined4 uVar11;
  undefined4 in_stack_ffffffffffffc1b4;
  undefined4 in_stack_ffffffffffffc1b8;
  undefined4 uVar12;
  NetType in_stack_ffffffffffffc1bc;
  undefined4 uVar13;
  ElementsAddressFactory *in_stack_ffffffffffffc1c0;
  ConfidentialTransactionContext *this_03;
  UtxoData *in_stack_ffffffffffffc1f0;
  undefined7 in_stack_ffffffffffffc1f8;
  undefined1 in_stack_ffffffffffffc1ff;
  UtxoData *in_stack_ffffffffffffc200;
  ConfidentialAssetId *in_stack_ffffffffffffc228;
  undefined4 in_stack_ffffffffffffc230;
  undefined1 in_stack_ffffffffffffc234;
  undefined1 in_stack_ffffffffffffc236;
  undefined8 in_stack_ffffffffffffc250;
  allocator *paVar14;
  ConfidentialAssetId *in_stack_ffffffffffffc258;
  undefined2 in_stack_ffffffffffffc260;
  undefined1 in_stack_ffffffffffffc262;
  undefined1 in_stack_ffffffffffffc263;
  undefined1 in_stack_ffffffffffffc264;
  undefined1 in_stack_ffffffffffffc265;
  undefined1 in_stack_ffffffffffffc266;
  undefined1 in_stack_ffffffffffffc267;
  ElementsConfidentialAddress *in_stack_ffffffffffffc268;
  ConfidentialTransactionContext *in_stack_ffffffffffffc270;
  undefined1 ***local_3cf8;
  AssertHelper local_3c80;
  Message local_3c78;
  undefined4 local_3c6c;
  AssertionResult local_3c68;
  uint local_3c54;
  AssertHelper local_3c50;
  Message local_3c48;
  undefined4 local_3c40;
  uint32_t local_3c3c;
  AssertionResult local_3c38;
  AssertHelper local_3c28;
  Message local_3c20;
  string local_3c18;
  AssertionResult local_3bf8;
  AssertHelper local_3be8;
  Message local_3be0;
  int64_t local_3bd8;
  int64_t local_3bd0;
  undefined1 local_3bc8;
  Amount local_3bc0;
  int64_t local_3bb0;
  AssertionResult local_3ba8;
  AssertHelper local_3b98;
  Message local_3b90;
  ByteData local_3b88;
  AssertHelper local_3b70;
  Message local_3b68;
  OutPoint local_3b60;
  AssertHelper local_3b38;
  Message local_3b30 [2];
  CoinSelectionOption *in_stack_ffffffffffffc4e0;
  string local_3b18;
  Privkey local_3af8;
  allocator local_3ad1;
  string local_3ad0;
  Pubkey local_3ab0;
  OutPoint local_3a98;
  AssertHelper local_3a70;
  Message local_3a68 [2];
  ByteData local_3a58;
  byte local_3a39;
  ConstCharPtr local_3a38;
  AssertHelper local_3a30;
  Message local_3a28;
  OutPoint local_3a20;
  AssertHelper local_39f8;
  Message local_39f0;
  SigHashType local_39e8;
  allocator local_39d9;
  string local_39d8;
  Privkey local_39b8;
  allocator local_3991;
  string local_3990;
  Pubkey local_3970;
  OutPoint local_3958;
  AssertHelper local_3930;
  Message local_3928 [2];
  ByteData local_3918;
  byte local_38f9;
  ConstCharPtr local_38f8;
  AssertHelper local_38f0;
  Message local_38e8;
  OutPoint local_38e0;
  AssertHelper local_38b8;
  Message local_38b0;
  undefined7 in_stack_ffffffffffffc758;
  undefined1 in_stack_ffffffffffffc75f;
  ConfidentialTransactionContext *in_stack_ffffffffffffc760;
  Privkey *in_stack_ffffffffffffc768;
  Pubkey *in_stack_ffffffffffffc770;
  undefined8 in_stack_ffffffffffffc778;
  undefined8 in_stack_ffffffffffffc780;
  ByteData256 *in_stack_ffffffffffffc790;
  ByteData *in_stack_ffffffffffffc798;
  allocator local_3851;
  string local_3850;
  Pubkey local_3830;
  OutPoint local_3818;
  ByteData local_37f0;
  AssertHelper local_37d8;
  Message local_37d0 [2];
  string local_37c0 [24];
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffc858;
  ConfidentialTransactionContext *in_stack_ffffffffffffc860;
  string local_36c8 [3];
  ElementsTransactionApi local_3651;
  int64_t local_3650;
  undefined1 local_3648;
  int64_t local_3640;
  undefined1 local_3638;
  Amount local_3630;
  int64_t local_3620;
  undefined1 local_3618;
  ConfidentialTransaction local_3610 [3];
  Amount local_3538;
  CoinSelectionOption local_3528;
  string local_34c0;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_34a0;
  _Base_ptr local_3478;
  undefined1 local_3470;
  string local_3468;
  string local_3448;
  AbstractTransactionController local_3428 [3];
  _Base_ptr local_33f8;
  undefined1 local_33f0;
  Amount local_33e8;
  string local_33d8 [2];
  undefined1 local_3388 [192];
  Pubkey local_32c8;
  ElementsConfidentialAddress local_32b0;
  Extkey local_30f8;
  Pubkey local_3068;
  ElementsConfidentialAddress local_3050;
  Extkey local_2e98;
  Pubkey local_2e08;
  ElementsConfidentialAddress local_2df0;
  undefined8 **local_2c30;
  undefined1 **local_2c28 [33];
  double in_stack_ffffffffffffd4e0;
  undefined1 in_stack_ffffffffffffd4ef;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  *in_stack_ffffffffffffd4f0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  *in_stack_ffffffffffffd4f8;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffd500;
  string *in_stack_ffffffffffffd508;
  ElementsTransactionApi *in_stack_ffffffffffffd510;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffd530;
  ConfidentialAssetId *in_stack_ffffffffffffd538;
  Amount *in_stack_ffffffffffffd548;
  UtxoFilter *in_stack_ffffffffffffd550;
  CoinSelectionOption *in_stack_ffffffffffffd558;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffd560;
  NetType_conflict in_stack_ffffffffffffd568;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *in_stack_ffffffffffffd570;
  Amount *in_stack_ffffffffffffd578;
  undefined1 local_2700 [1320];
  undefined1 local_21d8 [1320];
  undefined8 **local_1cb0;
  undefined8 local_1ca8;
  allocator local_1c81;
  string local_1c80;
  ExtPubkey local_1c60;
  allocator local_1bc9;
  string local_1bc8 [32];
  Address local_1ba8;
  allocator local_1a21;
  string local_1a20 [32];
  Address local_1a00;
  allocator local_1879;
  string local_1878 [32];
  Address local_1858;
  Amount local_16d8;
  allocator local_16c1;
  string local_16c0 [32];
  Address local_16a0;
  allocator local_1519;
  string local_1518;
  Script local_14f8;
  allocator local_14b9;
  string local_14b8;
  Txid local_1498;
  undefined8 local_1478;
  Txid local_1450;
  uint32_t local_1430;
  Script local_1428 [2];
  Address local_13b8;
  string local_1238 [32];
  Amount local_1218;
  undefined4 local_1208;
  undefined8 local_1200;
  ConfidentialAssetId local_11f8 [17];
  Amount local_f50;
  allocator local_f39;
  string local_f38 [32];
  Address local_f18;
  allocator local_d91;
  string local_d90;
  Script local_d70;
  allocator local_d31;
  string local_d30;
  Txid local_d10;
  undefined8 local_cf0;
  Txid local_cc8;
  uint32_t local_ca8;
  Script local_ca0 [2];
  Address local_c30;
  string local_ab0 [32];
  int64_t local_a90;
  undefined1 local_a88;
  undefined4 local_a80;
  undefined8 local_a78;
  ConfidentialAssetId local_a70 [17];
  Amount local_7c8;
  allocator local_7b1;
  string local_7b0 [32];
  Address local_790;
  allocator local_609;
  string local_608;
  Script local_5e8;
  allocator local_5a9;
  string local_5a8;
  Txid local_588;
  undefined8 local_558;
  Txid local_530;
  uint32_t local_510;
  Script local_508 [2];
  Address local_498;
  string local_318 [32];
  Amount local_2f8;
  undefined4 local_2e8;
  undefined8 local_2e0;
  ConfidentialAssetId local_2d8 [18];
  
  cfd::ElementsAddressFactory::ElementsAddressFactory
            (in_stack_ffffffffffffc1c0,in_stack_ffffffffffffc1bc);
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffc1f0);
  local_558 = 0;
  local_2e0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5a8,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,&local_5a9);
  cfd::core::Txid::Txid(&local_588,&local_5a8);
  cfd::core::Txid::operator=(&local_530,&local_588);
  cfd::core::Txid::~Txid((Txid *)0x2d85d6);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
  local_510 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_608,"76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac",&local_609);
  cfd::core::Script::Script(&local_5e8,&local_608);
  cfd::core::Script::operator=(local_508,&local_5e8);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffc180);
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator((allocator<char> *)&local_609);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7b0,"2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph",&local_7b1);
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffc18c,in_stack_ffffffffffffc188),
             (string *)in_stack_ffffffffffffc180);
  cfd::core::Address::operator=(&local_498,&local_790);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffc180);
  std::__cxx11::string::~string(local_7b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
  std::__cxx11::string::operator=
            (local_318,"pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)");
  cfd::core::Amount::Amount(&local_7c8,300000000000000);
  local_2f8.ignore_check_ = local_7c8.ignore_check_;
  local_2f8.amount_ = local_7c8.amount_;
  local_2e8 = 2;
  cfd::core::ConfidentialAssetId::operator=(local_2d8,&exp_dummy_asset_a);
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffc1f0);
  local_cf0 = 0;
  local_a78 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d30,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3"
             ,&local_d31);
  cfd::core::Txid::Txid(&local_d10,&local_d30);
  cfd::core::Txid::operator=(&local_cc8,&local_d10);
  cfd::core::Txid::~Txid((Txid *)0x2d8816);
  std::__cxx11::string::~string((string *)&local_d30);
  std::allocator<char>::~allocator((allocator<char> *)&local_d31);
  local_ca8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d90,"a9145d54db96a28f844a744e393fcd699d6f825b284187",&local_d91);
  cfd::core::Script::Script(&local_d70,&local_d90);
  cfd::core::Script::operator=(local_ca0,&local_d70);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffc180);
  std::__cxx11::string::~string((string *)&local_d90);
  std::allocator<char>::~allocator((allocator<char> *)&local_d91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f38,"XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE",&local_f39);
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffc18c,in_stack_ffffffffffffc188),
             (string *)in_stack_ffffffffffffc180);
  cfd::core::Address::operator=(&local_c30,&local_f18);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffc180);
  std::__cxx11::string::~string(local_f38);
  std::allocator<char>::~allocator((allocator<char> *)&local_f39);
  std::__cxx11::string::operator=
            (local_ab0,
             "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))");
  cfd::core::Amount::Amount(&local_f50,400000000000000);
  local_a88 = local_f50.ignore_check_;
  local_a90 = local_f50.amount_;
  local_a80 = 6;
  cfd::core::ConfidentialAssetId::operator=(local_a70,&exp_dummy_asset_a);
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffc1f0);
  local_1478 = 0;
  local_1200 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_14b8,
             "4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",&local_14b9);
  cfd::core::Txid::Txid(&local_1498,&local_14b8);
  cfd::core::Txid::operator=(&local_1450,&local_1498);
  cfd::core::Txid::~Txid((Txid *)0x2d8a56);
  std::__cxx11::string::~string((string *)&local_14b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_14b9);
  local_1430 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1518,"0014f330ed8383f8afdc977dd88600eb8ff120ba15e4",&local_1519);
  cfd::core::Script::Script(&local_14f8,&local_1518);
  cfd::core::Script::operator=(local_1428,&local_14f8);
  cfd::core::Script::~Script((Script *)in_stack_ffffffffffffc180);
  std::__cxx11::string::~string((string *)&local_1518);
  std::allocator<char>::~allocator((allocator<char> *)&local_1519);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_16c0,"ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w",&local_16c1)
  ;
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffc18c,in_stack_ffffffffffffc188),
             (string *)in_stack_ffffffffffffc180);
  cfd::core::Address::operator=(&local_13b8,&local_16a0);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffc180);
  std::__cxx11::string::~string(local_16c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_16c1);
  std::__cxx11::string::operator=
            (local_1238,"wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)");
  cfd::core::Amount::Amount(&local_16d8,300000000000000);
  local_1218.ignore_check_ = local_16d8.ignore_check_;
  local_1218.amount_ = local_16d8.amount_;
  local_1208 = 4;
  cfd::core::ConfidentialAssetId::operator=(local_11f8,&exp_dummy_asset_a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1878,"2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph",&local_1879);
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffc18c,in_stack_ffffffffffffc188),
             (string *)in_stack_ffffffffffffc180);
  std::__cxx11::string::~string(local_1878);
  std::allocator<char>::~allocator((allocator<char> *)&local_1879);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a20,"ert1qg4nrukf07cf4slc0m4h8gq6v2guhzrw2ayudpu",&local_1a21)
  ;
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffc18c,in_stack_ffffffffffffc188),
             (string *)in_stack_ffffffffffffc180);
  std::__cxx11::string::~string(local_1a20);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1bc8,"ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w",&local_1bc9)
  ;
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffc18c,in_stack_ffffffffffffc188),
             (string *)in_stack_ffffffffffffc180);
  std::__cxx11::string::~string(local_1bc8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1bc9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1c80,
             "xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy"
             ,&local_1c81);
  cfd::core::ExtPubkey::ExtPubkey(&local_1c60,&local_1c80);
  std::__cxx11::string::~string((string *)&local_1c80);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c81);
  local_2c30 = local_2c28;
  cfd::UtxoData::UtxoData
            (in_stack_ffffffffffffc200,
             (UtxoData *)CONCAT17(in_stack_ffffffffffffc1ff,in_stack_ffffffffffffc1f8));
  local_2c30 = (undefined8 **)local_2700;
  cfd::UtxoData::UtxoData
            (in_stack_ffffffffffffc200,
             (UtxoData *)CONCAT17(in_stack_ffffffffffffc1ff,in_stack_ffffffffffffc1f8));
  local_2c30 = (undefined8 **)local_21d8;
  cfd::UtxoData::UtxoData
            (in_stack_ffffffffffffc200,
             (UtxoData *)CONCAT17(in_stack_ffffffffffffc1ff,in_stack_ffffffffffffc1f8));
  local_1cb0 = local_2c28;
  local_1ca8 = 3;
  std::allocator<cfd::UtxoData>::allocator((allocator<cfd::UtxoData> *)0x2d8e37);
  __l._M_array._4_4_ = in_stack_ffffffffffffc1bc;
  __l._M_array._0_4_ = in_stack_ffffffffffffc1b8;
  __l._M_len = (size_type)in_stack_ffffffffffffc1c0;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
             CONCAT44(in_stack_ffffffffffffc1b4,in_stack_ffffffffffffc1b0),__l,
             in_stack_ffffffffffffc1a8);
  std::allocator<cfd::UtxoData>::~allocator((allocator<cfd::UtxoData> *)0x2d8e6b);
  local_3cf8 = (undefined1 ***)&local_1cb0;
  do {
    local_3cf8 = local_3cf8 + -0xa5;
    cfd::UtxoData::~UtxoData(in_stack_ffffffffffffc180);
    uVar2 = (undefined1)((ulong)in_stack_ffffffffffffc250 >> 0x38);
  } while (local_3cf8 != local_2c28);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&local_2e98,&local_1c60,0x5b);
  cfd::core::Extkey::GetPubkey(&local_2e08,&local_2e98);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_2df0,&local_1858,&local_2e08);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2d8f21);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)0x2d8f2e);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&local_30f8,&local_1c60,0x5c);
  cfd::core::Extkey::GetPubkey(&local_3068,&local_30f8);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_3050,&local_1a00,&local_3068);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2d8f8d);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)0x2d8f9a);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)(local_3388 + 0x30),&local_1c60,0x5d);
  cfd::core::Extkey::GetPubkey(&local_32c8,(Extkey *)(local_3388 + 0x30));
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_32b0,&local_1ba8,&local_32c8);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2d8ff9);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)0x2d9006);
  local_3388._40_8_ = (_func_int **)0x3fbc28f5c28f5c29;
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_3388,&exp_dummy_asset_a);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
         *)0x2d903b);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(local_33d8,&exp_dummy_asset_a);
  cfd::core::Amount::Amount(&local_33e8,0);
  pVar7 = std::
          map<std::__cxx11::string,cfd::core::Amount,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
          ::emplace<std::__cxx11::string,cfd::core::Amount>
                    ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
                      *)in_stack_ffffffffffffc190,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffc18c,in_stack_ffffffffffffc188),
                     (Amount *)in_stack_ffffffffffffc180);
  local_33f8 = (_Base_ptr)pVar7.first._M_node;
  local_33f0 = pVar7.second;
  std::__cxx11::string::~string((string *)local_33d8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x2d90ca);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_3448,&exp_dummy_asset_a);
  cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_(&local_3468,&local_32b0);
  pVar8 = std::
          map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::emplace<std::__cxx11::string,std::__cxx11::string>
                    (in_stack_ffffffffffffc190,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffc18c,in_stack_ffffffffffffc188),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffc180);
  local_3478 = (_Base_ptr)pVar8.first._M_node;
  local_3470 = pVar8.second;
  std::__cxx11::string::~string((string *)&local_3468);
  std::__cxx11::string::~string((string *)&local_3448);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
          *)0x2d916a);
  cfd::core::Amount::Amount((Amount *)&local_34a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x2d9186);
  cfd::CoinSelectionOption::CoinSelectionOption((CoinSelectionOption *)in_stack_ffffffffffffc180);
  cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo(in_stack_ffffffffffffc4e0);
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate
            ((CoinSelectionOption *)in_stack_ffffffffffffc180,(double)in_stack_ffffffffffffc178);
  cfd::CoinSelectionOption::SetLongTermFeeBaserate
            ((CoinSelectionOption *)in_stack_ffffffffffffc180,(double)in_stack_ffffffffffffc178);
  cfd::CoinSelectionOption::SetFeeAsset
            ((CoinSelectionOption *)in_stack_ffffffffffffc180,in_stack_ffffffffffffc178);
  cfd::CoinSelectionOption::SetBlindInfo(&local_3528,0,0x34);
  cfd::core::Amount::Amount(&local_3538,10000);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)
             CONCAT44(in_stack_ffffffffffffc1b4,in_stack_ffffffffffffc1b0),
             (uint32_t)((ulong)in_stack_ffffffffffffc1a8 >> 0x20),
             (uint32_t)in_stack_ffffffffffffc1a8);
  AVar9 = cfd::core::operator+(&local_2f8,&local_1218);
  local_3640 = AVar9.amount_;
  local_3638 = AVar9.ignore_check_;
  local_3630.amount_ = local_3640;
  local_3630.ignore_check_ = (bool)local_3638;
  AVar9 = cfd::core::operator-(&local_3630,&local_3538);
  local_3650 = AVar9.amount_;
  local_3648 = AVar9.ignore_check_;
  local_3620 = local_3650;
  local_3618 = local_3648;
  cfd::ConfidentialTransactionContext::AddTxOut
            (in_stack_ffffffffffffc270,in_stack_ffffffffffffc268,
             (Amount *)
             CONCAT17(in_stack_ffffffffffffc267,
                      CONCAT16(in_stack_ffffffffffffc266,
                               CONCAT15(in_stack_ffffffffffffc265,
                                        CONCAT14(in_stack_ffffffffffffc264,
                                                 CONCAT13(in_stack_ffffffffffffc263,
                                                          CONCAT12(in_stack_ffffffffffffc262,
                                                                   in_stack_ffffffffffffc260)))))),
             in_stack_ffffffffffffc258,(bool)uVar2);
  cfd::ConfidentialTransactionContext::AddTxOut
            (in_stack_ffffffffffffc270,in_stack_ffffffffffffc268,
             (Amount *)
             CONCAT17(in_stack_ffffffffffffc267,
                      CONCAT16(in_stack_ffffffffffffc266,
                               CONCAT15(in_stack_ffffffffffffc265,
                                        CONCAT14(in_stack_ffffffffffffc264,
                                                 CONCAT13(in_stack_ffffffffffffc263,
                                                          CONCAT12(in_stack_ffffffffffffc262,
                                                                   in_stack_ffffffffffffc260)))))),
             in_stack_ffffffffffffc258,(bool)uVar2);
  cfd::api::ElementsTransactionApi::ElementsTransactionApi(&local_3651);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            (local_36c8,&local_3610[0].super_AbstractTransaction);
  tx_hex = &local_34c0;
  pcVar6 = (char *)((long)&local_34c0.field_2 + 0xc);
  this_02 = &local_34a0;
  this_01 = (UtxoData *)local_3388;
  this_00 = local_3428;
  this_03 = (ConfidentialTransactionContext *)0x0;
  uVar12 = 0;
  uVar13 = 0;
  uVar11 = 4;
  uVar10 = 1;
  cfd::api::ElementsTransactionApi::FundRawTransaction
            (in_stack_ffffffffffffd510,in_stack_ffffffffffffd508,in_stack_ffffffffffffd500,
             in_stack_ffffffffffffd4f8,in_stack_ffffffffffffd4f0,in_stack_ffffffffffffd530,
             in_stack_ffffffffffffd538,(bool)in_stack_ffffffffffffd4ef,in_stack_ffffffffffffd4e0,
             in_stack_ffffffffffffd548,in_stack_ffffffffffffd550,in_stack_ffffffffffffd558,
             in_stack_ffffffffffffd560,in_stack_ffffffffffffd568,in_stack_ffffffffffffd570,
             in_stack_ffffffffffffd578);
  std::__cxx11::string::~string((string *)local_36c8);
  cfd::AbstractTransactionController::GetHex_abi_cxx11_(this_00);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)CONCAT44(in_stack_ffffffffffffc1b4,uVar11),tx_hex);
  cfd::ConfidentialTransactionContext::operator=
            (this_03,(ConfidentialTransactionContext *)CONCAT44(uVar13,uVar12));
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)this_01);
  std::__cxx11::string::~string(local_37c0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::CollectInputUtxo
                (in_stack_ffffffffffffc860,in_stack_ffffffffffffc858);
    }
  }
  else {
    testing::Message::Message(local_37d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_37d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x3a6,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_37d8,local_37d0);
    testing::internal::AssertHelper::~AssertHelper(&local_37d8);
    testing::Message::~Message((Message *)0x2d9e8c);
  }
  cfd::core::ByteData::ByteData(&local_37f0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_3818,&local_530,local_510);
      paVar14 = &local_3851;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_3850,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",paVar14);
      cfd::core::Pubkey::Pubkey(&local_3830,&local_3850);
      paVar14 = (allocator *)&stack0xffffffffffffc767;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffc768,
                 "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",paVar14);
      cfd::core::Privkey::FromWif
                ((Privkey *)&stack0xffffffffffffc788,(string *)&stack0xffffffffffffc768,kTestnet,
                 true);
      cfd::core::SigHashType::SigHashType((SigHashType *)&stack0xffffffffffffc758);
      this_01 = (UtxoData *)0x0;
      cfd::ConfidentialTransactionContext::SignWithKey
                ((ConfidentialTransactionContext *)in_stack_ffffffffffffc780,
                 (OutPoint *)in_stack_ffffffffffffc778,in_stack_ffffffffffffc770,
                 in_stack_ffffffffffffc768,(SigHashType *)in_stack_ffffffffffffc760,
                 (bool)in_stack_ffffffffffffc75f,in_stack_ffffffffffffc790,in_stack_ffffffffffffc798
                );
      cfd::core::Privkey::~Privkey((Privkey *)0x2da03e);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffc768);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffc767);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x2da065);
      std::__cxx11::string::~string((string *)&local_3850);
      std::allocator<char>::~allocator((allocator<char> *)&local_3851);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2da08c);
    }
  }
  else {
    testing::Message::Message(&local_38b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_38b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x3ad,
               "Expected: txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_38b8,&local_38b0);
    testing::internal::AssertHelper::~AssertHelper(&local_38b8);
    testing::Message::~Message((Message *)0x2da21e);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_38e0,&local_530,local_510);
      cfd::ConfidentialTransactionContext::Verify
                (in_stack_ffffffffffffc760,
                 (OutPoint *)CONCAT17(in_stack_ffffffffffffc75f,in_stack_ffffffffffffc758));
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2da2e7);
    }
  }
  else {
    testing::Message::Message(&local_38e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_38f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x3ae,
               "Expected: txc.Verify(OutPoint(utxo1.txid, utxo1.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_38f0,&local_38e8);
    testing::internal::AssertHelper::~AssertHelper(&local_38f0);
    testing::Message::~Message((Message *)0x2da3b1);
  }
  testing::internal::ConstCharPtr::ConstCharPtr(&local_38f8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_38f8);
  if (bVar1) {
    local_38f9 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::Finalize
                ((ConfidentialTransactionContext *)CONCAT44(in_stack_ffffffffffffc18c,uVar10));
      cfd::core::ByteData::operator=(&local_37f0,&local_3918);
      cfd::core::ByteData::~ByteData((ByteData *)0x2da499);
    }
    if ((local_38f9 & 1) == 0) {
      local_38f8.value =
           "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_002da55f;
    }
  }
  else {
LAB_002da55f:
    testing::Message::Message(local_3928);
    testing::internal::AssertHelper::AssertHelper
              (&local_3930,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x3af,local_38f8.value);
    testing::internal::AssertHelper::operator=(&local_3930,local_3928);
    testing::internal::AssertHelper::~AssertHelper(&local_3930);
    testing::Message::~Message((Message *)0x2da5c7);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_3958,&local_cc8,local_ca8);
      paVar14 = &local_3991;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_3990,
                 "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27",paVar14);
      cfd::core::Pubkey::Pubkey(&local_3970,&local_3990);
      paVar14 = &local_39d9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_39d8,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP",
                 paVar14);
      cfd::core::Privkey::FromWif(&local_39b8,&local_39d8,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_39e8);
      this_01 = (UtxoData *)0x0;
      cfd::ConfidentialTransactionContext::SignWithKey
                ((ConfidentialTransactionContext *)in_stack_ffffffffffffc780,
                 (OutPoint *)in_stack_ffffffffffffc778,in_stack_ffffffffffffc770,
                 in_stack_ffffffffffffc768,(SigHashType *)in_stack_ffffffffffffc760,
                 (bool)in_stack_ffffffffffffc75f,in_stack_ffffffffffffc790,in_stack_ffffffffffffc798
                );
      cfd::core::Privkey::~Privkey((Privkey *)0x2da76a);
      std::__cxx11::string::~string((string *)&local_39d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_39d9);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x2da791);
      std::__cxx11::string::~string((string *)&local_3990);
      std::allocator<char>::~allocator((allocator<char> *)&local_3991);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2da7b8);
    }
  }
  else {
    testing::Message::Message(&local_39f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_39f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x3b4,
               "Expected: txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout), Pubkey(\"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27\"), Privkey::FromWif( \"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_39f8,&local_39f0);
    testing::internal::AssertHelper::~AssertHelper(&local_39f8);
    testing::Message::~Message((Message *)0x2da931);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_3a20,&local_cc8,local_ca8);
      cfd::ConfidentialTransactionContext::Verify
                (in_stack_ffffffffffffc760,
                 (OutPoint *)CONCAT17(in_stack_ffffffffffffc75f,in_stack_ffffffffffffc758));
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2da9fa);
    }
  }
  else {
    testing::Message::Message(&local_3a28);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x3b5,
               "Expected: txc.Verify(OutPoint(utxo2.txid, utxo2.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3a30,&local_3a28);
    testing::internal::AssertHelper::~AssertHelper(&local_3a30);
    testing::Message::~Message((Message *)0x2daac4);
  }
  testing::internal::ConstCharPtr::ConstCharPtr(&local_3a38,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_3a38);
  if (bVar1) {
    local_3a39 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::Finalize
                ((ConfidentialTransactionContext *)CONCAT44(in_stack_ffffffffffffc18c,uVar10));
      cfd::core::ByteData::operator=(&local_37f0,&local_3a58);
      cfd::core::ByteData::~ByteData((ByteData *)0x2dabac);
    }
    if ((local_3a39 & 1) != 0) goto LAB_002dad25;
    local_3a38.value =
         "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_3a68);
  testing::internal::AssertHelper::AssertHelper
            (&local_3a70,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
             ,0x3b6,local_3a38.value);
  testing::internal::AssertHelper::operator=(&local_3a70,local_3a68);
  testing::internal::AssertHelper::~AssertHelper(&local_3a70);
  testing::Message::~Message((Message *)0x2dacda);
LAB_002dad25:
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_3a98,&local_1450,local_1430);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_3ad0,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",&local_3ad1);
      cfd::core::Pubkey::Pubkey(&local_3ab0,&local_3ad0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_3b18,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",
                 (allocator *)&stack0xffffffffffffc4e7);
      cfd::core::Privkey::FromWif(&local_3af8,&local_3b18,kTestnet,true);
      cfd::core::SigHashType::SigHashType((SigHashType *)(local_3b30 + 1));
      this_01 = (UtxoData *)0x0;
      cfd::ConfidentialTransactionContext::SignWithKey
                ((ConfidentialTransactionContext *)in_stack_ffffffffffffc780,
                 (OutPoint *)in_stack_ffffffffffffc778,in_stack_ffffffffffffc770,
                 in_stack_ffffffffffffc768,(SigHashType *)in_stack_ffffffffffffc760,
                 (bool)in_stack_ffffffffffffc75f,in_stack_ffffffffffffc790,in_stack_ffffffffffffc798
                );
      cfd::core::Privkey::~Privkey((Privkey *)0x2dae7d);
      std::__cxx11::string::~string((string *)&local_3b18);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffc4e7);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x2daea4);
      std::__cxx11::string::~string((string *)&local_3ad0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3ad1);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2daecb);
    }
  }
  else {
    testing::Message::Message(local_3b30);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x3bb,
               "Expected: txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3b38,local_3b30);
    testing::internal::AssertHelper::~AssertHelper(&local_3b38);
    testing::Message::~Message((Message *)0x2db044);
  }
  uVar2 = testing::internal::AlwaysTrue();
  if ((bool)uVar2) {
    in_stack_ffffffffffffc236 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_ffffffffffffc236) {
      cfd::core::OutPoint::OutPoint(&local_3b60,&local_1450,local_1430);
      cfd::ConfidentialTransactionContext::Verify
                (in_stack_ffffffffffffc760,
                 (OutPoint *)CONCAT17(in_stack_ffffffffffffc75f,in_stack_ffffffffffffc758));
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x2db10d);
    }
  }
  else {
    testing::Message::Message(&local_3b68);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x3bc,
               "Expected: txc.Verify(OutPoint(utxo3.txid, utxo3.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3b70,&local_3b68);
    testing::internal::AssertHelper::~AssertHelper(&local_3b70);
    testing::Message::~Message((Message *)0x2db1d7);
  }
  uVar3 = testing::internal::AlwaysTrue();
  if ((bool)uVar3) {
    in_stack_ffffffffffffc234 = testing::internal::AlwaysTrue();
    if ((bool)in_stack_ffffffffffffc234) {
      cfd::ConfidentialTransactionContext::Finalize
                ((ConfidentialTransactionContext *)CONCAT44(in_stack_ffffffffffffc18c,uVar10));
      cfd::core::ByteData::operator=(&local_37f0,&local_3b88);
      cfd::core::ByteData::~ByteData((ByteData *)0x2db299);
    }
  }
  else {
    testing::Message::Message(&local_3b90);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x3be,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_3b98,&local_3b90);
    testing::internal::AssertHelper::~AssertHelper(&local_3b98);
    testing::Message::~Message((Message *)0x2db363);
  }
  AVar9 = cfd::ConfidentialTransactionContext::GetFeeAmount
                    ((ConfidentialTransactionContext *)
                     CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffc236,
                                             CONCAT15(uVar3,CONCAT14(in_stack_ffffffffffffc234,
                                                                     in_stack_ffffffffffffc230)))),
                     in_stack_ffffffffffffc228);
  local_3bd0 = AVar9.amount_;
  local_3bc8 = AVar9.ignore_check_;
  local_3bc0.amount_ = local_3bd0;
  local_3bc0.ignore_check_ = (bool)local_3bc8;
  local_3bb0 = cfd::core::Amount::GetSatoshiValue(&local_3bc0);
  local_3bd8 = cfd::core::Amount::GetSatoshiValue((Amount *)&local_34a0);
  testing::internal::EqHelper<false>::Compare<long,long>
            (pcVar6,(char *)this_02,(long *)CONCAT44(in_stack_ffffffffffffc18c,uVar10),
             (long *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3ba8);
  if (!bVar1) {
    testing::Message::Message(&local_3be0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x2db4e4);
    testing::internal::AssertHelper::AssertHelper
              (&local_3be8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x3bf,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3be8,&local_3be0);
    testing::internal::AssertHelper::~AssertHelper(&local_3be8);
    testing::Message::~Message((Message *)0x2db547);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2db59f);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_3c18,&local_37f0);
  pcVar5 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_3bf8,"tx.GetHex().c_str()",
             "\"020000000103e3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402206454682354c6da513edad5380f2e83fffcae69d5004c61fee3452f371596b6d20220413f7978b23b25da56afd237db9f6532256a2962e400e4bbf01f70f318725cc401210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffff040100000000000000000000000000000000000000000000000000000000000000aa01000221b262dd58f00308f34c0c7de1a49ec53acb73aeb94306a90987759c2c012492e877a0dde821d91976a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac0100000000000000000000000000000000000000000000000000000000000000aa0100016bcc41e9000002761f92316d668b7ad54ea7da8f4bfd1b266d677e9786b98274f647cc74ae306e16001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa0100000000000001b500000100000000000000000000000000000000000000000000000000000000000000aa01000000000000255b029e1f4cd73bb6d29257ca37a3882cd09661783c90cdd92b57264a13bdab822905160014f330ed8383f8afdc977dd88600eb8ff120ba15e40000000000000247304402201f8ab340cc5c6c85ff01f8cb48649ae111f0eecefce996cee79835270942631d02207f2d32c047ed8b3b02e9bca2d9c237243bb3564ccb353fca9678844eb36c691701210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000002473044022061d1a2c6903da2571ca14cfcdcec006ac3b95dc10a75b34d73b0a426003ba6c0022058e7453692dbe1d23c4f2676d567f04a737791edc025004c3c553bab6cec81d301210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b00000000000000000000000000\""
             ,pcVar5,
             "020000000103e3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402206454682354c6da513edad5380f2e83fffcae69d5004c61fee3452f371596b6d20220413f7978b23b25da56afd237db9f6532256a2962e400e4bbf01f70f318725cc401210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffff040100000000000000000000000000000000000000000000000000000000000000aa01000221b262dd58f00308f34c0c7de1a49ec53acb73aeb94306a90987759c2c012492e877a0dde821d91976a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac0100000000000000000000000000000000000000000000000000000000000000aa0100016bcc41e9000002761f92316d668b7ad54ea7da8f4bfd1b266d677e9786b98274f647cc74ae306e16001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa0100000000000001b500000100000000000000000000000000000000000000000000000000000000000000aa01000000000000255b029e1f4cd73bb6d29257ca37a3882cd09661783c90cdd92b57264a13bdab822905160014f330ed8383f8afdc977dd88600eb8ff120ba15e40000000000000247304402201f8ab340cc5c6c85ff01f8cb48649ae111f0eecefce996cee79835270942631d02207f2d32c047ed8b3b02e9bca2d9c237243bb3564ccb353fca9678844eb36c691701210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000002473044022061d1a2c6903da2571ca14cfcdcec006ac3b95dc10a75b34d73b0a426003ba6c0022058e7453692dbe1d23c4f2676d567f04a737791edc025004c3c553bab6cec81d301210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b00000000000000000000000000"
            );
  std::__cxx11::string::~string((string *)&local_3c18);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3bf8);
  if (!bVar1) {
    testing::Message::Message(&local_3c20);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x2db68c);
    testing::internal::AssertHelper::AssertHelper
              (&local_3c28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x3c0,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3c28,&local_3c20);
    testing::internal::AssertHelper::~AssertHelper(&local_3c28);
    testing::Message::~Message((Message *)0x2db6e9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2db741);
  local_3c3c = cfd::core::ConfidentialTransaction::GetVsize(local_3610);
  local_3c40 = 0x296;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (pcVar6,(char *)this_02,(uint *)CONCAT44(in_stack_ffffffffffffc18c,uVar10),
             (int *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3c38);
  if (!bVar1) {
    testing::Message::Message(&local_3c48);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x2db800);
    testing::internal::AssertHelper::AssertHelper
              (&local_3c50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x3c1,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3c50,&local_3c48);
    testing::internal::AssertHelper::~AssertHelper(&local_3c50);
    testing::Message::~Message((Message *)0x2db85d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2db8b5);
  uVar4 = cfd::core::ConfidentialTransaction::GetVsize(local_3610);
  local_3c54 = (uVar4 * (int)(long)((double)local_3388._40_8_ * 100.0)) / 100;
  local_3c6c = 0x48;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (pcVar6,(char *)this_02,(uint *)CONCAT44(in_stack_ffffffffffffc18c,uVar10),
             (int *)this_01);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3c68);
  if (!bVar1) {
    testing::Message::Message(&local_3c78);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)0x2db99c);
    testing::internal::AssertHelper::AssertHelper
              (&local_3c80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x3c4,pcVar6);
    testing::internal::AssertHelper::operator=(&local_3c80,&local_3c78);
    testing::internal::AssertHelper::~AssertHelper(&local_3c80);
    testing::Message::~Message((Message *)0x2db9f9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2dba51);
  cfd::core::ByteData::~ByteData((ByteData *)0x2dba5e);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController
            ((ConfidentialTransactionController *)this_01);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)this_01);
  cfd::CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x2dba85);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_02);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
           *)this_02);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x2dbaac);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
          *)0x2dbab9);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x2dbac6);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)this_01);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)this_01);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)this_01);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(this_02);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)0x2dbb07);
  cfd::core::Address::~Address((Address *)this_01);
  cfd::core::Address::~Address((Address *)this_01);
  cfd::core::Address::~Address((Address *)this_01);
  cfd::UtxoData::~UtxoData(this_01);
  cfd::UtxoData::~UtxoData(this_01);
  cfd::UtxoData::~UtxoData(this_01);
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x2dbb62);
  return;
}

Assistant:

TEST(ElementsTransactionApi, FundRawTransaction_MillionAmountValue) {
  ElementsAddressFactory factory(NetType::kElementsRegtest);
  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph");
  utxo1.descriptor = "pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo1.amount = Amount(int64_t{300000000000000});
  utxo1.address_type = AddressType::kP2pkhAddress;
  utxo1.asset = exp_dummy_asset_a;

  // Address2 (pattern-x1)
  // pubkey: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 0;
  utxo2.locking_script = Script("a9145d54db96a28f844a744e393fcd699d6f825b284187");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE");
  utxo2.descriptor = "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))";
  utxo2.amount = Amount(int64_t{400000000000000});
  utxo2.address_type = AddressType::kP2shP2wpkhAddress;
  utxo2.asset = exp_dummy_asset_a;

  // Address3
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo3.vout = 1;
  utxo3.locking_script = Script("0014f330ed8383f8afdc977dd88600eb8ff120ba15e4");
  // utxo1.redeem_script = Script("");
  utxo3.address = factory.GetAddress("ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w");
  utxo3.descriptor = "wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo3.amount = Amount(int64_t{300000000000000});
  utxo3.address_type = AddressType::kP2wpkhAddress;
  utxo3.asset = exp_dummy_asset_a;

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  Address address1 = factory.GetAddress("2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph");
  // "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"
  Address address2 = factory.GetAddress("ert1qg4nrukf07cf4slc0m4h8gq6v2guhzrw2ayudpu");
  Address address3 = factory.GetAddress("ert1q7vcwmqurlzhae9mamzrqp6u07yst590yvg8j0w");

  ExtPubkey key = ExtPubkey("xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy");

  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};

  ElementsConfidentialAddress reserve_ct_addr1 = ElementsConfidentialAddress(
      address1, key.DerivePubkey(91).GetPubkey());
  ElementsConfidentialAddress reserve_ct_addr2 = ElementsConfidentialAddress(
      address2, key.DerivePubkey(92).GetPubkey());
  ElementsConfidentialAddress reserve_ct_addr3 = ElementsConfidentialAddress(
      address3, key.DerivePubkey(93).GetPubkey());

  double fee_rate = 0.11;
  ConfidentialAssetId fee_asset = exp_dummy_asset_a;
  std::map<std::string, Amount> map_target_value;
  map_target_value.emplace(exp_dummy_asset_a.GetHex(), Amount(int64_t{0}));
  std::map<std::string, std::string> reserve_txout_address;
  reserve_txout_address.emplace(exp_dummy_asset_a.GetHex(), reserve_ct_addr3.GetAddress());
  std::vector<ElementsUtxoAndOption> selected_txin_utxos;
  Amount estimate_fee;
  UtxoFilter filter;
  std::vector<std::string> append_txout_addresses;
  CoinSelectionOption option;
  option.InitializeConfidentialTxSizeInfo();
  option.SetEffectiveFeeBaserate(fee_rate);
  option.SetLongTermFeeBaserate(fee_rate);
  option.SetFeeAsset(fee_asset);
  option.SetBlindInfo(0, 52);

  Amount fee(int64_t{10000});
  ConfidentialTransactionContext txc(2, 0);
  txc.AddTxOut(reserve_ct_addr1, utxo1.amount + utxo3.amount - fee, exp_dummy_asset_a);
  txc.AddTxOut(reserve_ct_addr2, utxo2.amount, exp_dummy_asset_a);

  ElementsTransactionApi api;
  ConfidentialTransactionController ctx = api.FundRawTransaction(
      txc.GetHex(), utxos, map_target_value, selected_txin_utxos,
      reserve_txout_address, fee_asset, true, fee_rate, &estimate_fee,
      &filter, &option, &append_txout_addresses, NetType::kElementsRegtest);

  txc = ConfidentialTransactionContext(ctx.GetHex());
  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));
  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout),
      Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
      Privkey::FromWif(
          "cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo2.txid, utxo2.vout)));
  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo3.txid, utxo3.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo3.txid, utxo3.vout)));

  EXPECT_NO_THROW(tx = txc.Finalize());
  EXPECT_EQ(txc.GetFeeAmount().GetSatoshiValue(), estimate_fee.GetSatoshiValue());
  EXPECT_STREQ(tx.GetHex().c_str(), "020000000103e3b9639791a30193e253c431ed93e3ca8a77334da50cccb252fd19b692915531000000001716001445663e592ff613587f0fdd6e74034c5239710dcaffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0100000000ffffffffa38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a000000006a47304402206454682354c6da513edad5380f2e83fffcae69d5004c61fee3452f371596b6d20220413f7978b23b25da56afd237db9f6532256a2962e400e4bbf01f70f318725cc401210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567bffffffff040100000000000000000000000000000000000000000000000000000000000000aa01000221b262dd58f00308f34c0c7de1a49ec53acb73aeb94306a90987759c2c012492e877a0dde821d91976a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac0100000000000000000000000000000000000000000000000000000000000000aa0100016bcc41e9000002761f92316d668b7ad54ea7da8f4bfd1b266d677e9786b98274f647cc74ae306e16001445663e592ff613587f0fdd6e74034c5239710dca0100000000000000000000000000000000000000000000000000000000000000aa0100000000000001b500000100000000000000000000000000000000000000000000000000000000000000aa01000000000000255b029e1f4cd73bb6d29257ca37a3882cd09661783c90cdd92b57264a13bdab822905160014f330ed8383f8afdc977dd88600eb8ff120ba15e40000000000000247304402201f8ab340cc5c6c85ff01f8cb48649ae111f0eecefce996cee79835270942631d02207f2d32c047ed8b3b02e9bca2d9c237243bb3564ccb353fca9678844eb36c691701210206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a2700000002473044022061d1a2c6903da2571ca14cfcdcec006ac3b95dc10a75b34d73b0a426003ba6c0022058e7453692dbe1d23c4f2676d567f04a737791edc025004c3c553bab6cec81d301210359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b00000000000000000000000000");
  EXPECT_EQ(txc.GetVsize(), 662);

  uint32_t minimum_fee = txc.GetVsize() * static_cast<uint32_t>(fee_rate * 100) / 100;
  EXPECT_EQ(minimum_fee, 72);
}